

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jglp.cpp
# Opt level: O0

void __thiscall merlin::jglp::run(jglp *this)

{
  allocator<merlin::my_set<unsigned_long>_> *this_00;
  allocator<merlin::factor> *this_01;
  ulong uVar1;
  findex idx;
  pointer B;
  value vVar2;
  flistIt fVar3;
  value_type_conflict i_00;
  undefined8 uVar4;
  const_iterator cVar5;
  bool bVar6;
  int iVar7;
  vector<merlin::factor,_std::allocator<merlin::factor>_> *__x;
  size_t sVar8;
  double dVar9;
  reference pvVar10;
  reference pvVar11;
  flist *__x_00;
  unsigned_long *puVar12;
  reference pvVar13;
  ostream *poVar14;
  reference puVar15;
  void *this_02;
  variable_set *pvVar16;
  factor *rhs;
  factor *B_00;
  undefined4 extraout_var;
  reference this_03;
  reference pvVar17;
  size_type sVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined1 auVar19 [16];
  variable vVar20;
  undefined1 local_4d0 [16];
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> local_4c0;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *local_4b0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_4a8;
  int local_4a0;
  int local_49c;
  int local_498;
  int local_494;
  int local_490;
  int local_48c;
  factor local_488;
  ulong local_428;
  size_t i_7;
  factor F;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3b8;
  flistIt j_1;
  size_t j;
  double maxf;
  factor local_368;
  value_type_conflict local_308;
  findex alpha;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_2f8;
  flistIt i_6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> alphas;
  size_type local_278;
  size_t i_5;
  ulong local_210;
  size_t i_4;
  factor fmatch;
  size_t i_3;
  variable_set var;
  undefined1 local_160 [8];
  vector<merlin::factor,_std::allocator<merlin::factor>_> ftmp;
  undefined1 local_130 [8];
  flist ids;
  variable VX;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_f8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_f0;
  const_iterator x;
  size_t i_2;
  undefined1 local_d8 [8];
  vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> New;
  undefined1 local_b8 [8];
  vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> Orig;
  ulong local_90;
  size_t i_1;
  vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> vin;
  double mx;
  size_t i;
  value_type_conflict1 local_58 [3];
  undefined1 local_40 [8];
  vector<double,_std::allocator<double>_> Norm;
  vector<merlin::factor,_std::allocator<merlin::factor>_> fin;
  jglp *this_local;
  
  dVar9 = timeSystem();
  (this->super_algorithm).m_start_time = dVar9;
  (*(this->super_graphical_model)._vptr_graphical_model[0xf])();
  __x = graphical_model::get_factors(&this->m_gmo);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
            ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
             &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__x);
  sVar8 = graphical_model::num_factors(&this->m_gmo);
  local_58[0] = 0.0;
  std::allocator<double>::allocator((allocator<double> *)((long)&i + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_40,sVar8,local_58,
             (allocator<double> *)((long)&i + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&i + 7));
  for (mx = 0.0; dVar9 = (double)graphical_model::num_factors(&this->m_gmo),
      (ulong)mx < (ulong)dVar9; mx = (double)((long)mx + 1)) {
    pvVar10 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                        ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                         &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(size_type)mx);
    B = (pointer)factor::max(pvVar10);
    vin.
    super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = B;
    pvVar10 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                        ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                         &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(size_type)mx);
    factor::operator/=(pvVar10,(value)B);
    dVar9 = ::log((double)vin.
                          super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_40,(size_type)mx);
    *pvVar11 = dVar9;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_40,(size_type)mx);
    this->m_logz = *pvVar11 + this->m_logz;
  }
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  vector((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> *)
         &i_1);
  for (local_90 = 0; sVar8 = graphical_model::nvar(&this->m_gmo), local_90 < sVar8;
      local_90 = local_90 + 1) {
    vVar20 = graphical_model::var(&this->super_graphical_model,local_90);
    Orig.
    super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)vVar20.m_label;
    __x_00 = graphical_model::with_variable
                       (&this->m_gmo,
                        (variable *)
                        &Orig.
                         super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
    push_back((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               *)&i_1,__x_00);
  }
  sVar8 = graphical_model::num_factors(&this->m_gmo);
  this_00 = (allocator<merlin::my_set<unsigned_long>_> *)
            ((long)&New.
                    super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<merlin::my_set<unsigned_long>_>::allocator(this_00);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  vector((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> *)
         local_b8,sVar8,this_00);
  std::allocator<merlin::my_set<unsigned_long>_>::~allocator
            ((allocator<merlin::my_set<unsigned_long>_> *)
             ((long)&New.
                     super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar8 = graphical_model::num_factors(&this->m_gmo);
  std::allocator<merlin::my_set<unsigned_long>_>::allocator
            ((allocator<merlin::my_set<unsigned_long>_> *)((long)&i_2 + 7));
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  vector((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> *)
         local_d8,sVar8,(allocator<merlin::my_set<unsigned_long>_> *)((long)&i_2 + 7));
  std::allocator<merlin::my_set<unsigned_long>_>::~allocator
            ((allocator<merlin::my_set<unsigned_long>_> *)((long)&i_2 + 7));
  for (x._M_current = (unsigned_long *)0x0; cVar5._M_current = x._M_current,
      puVar12 = (unsigned_long *)
                std::
                vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                ::size((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                        *)local_b8), cVar5._M_current < puVar12; x._M_current = x._M_current + 1) {
    pvVar13 = std::
              vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
              ::operator[]((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                            *)local_b8,(size_type)x._M_current);
    my_set<unsigned_long>::operator|=(pvVar13,(unsigned_long *)&x);
  }
  sVar8 = graphical_model::nvar(&this->m_gmo);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  resize(&this->m_mini_buckets,sVar8);
  poVar14 = std::operator<<((ostream *)&std::cout,"[JGLP] Initialize join graph ...");
  std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  local_f8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->m_order);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)&local_f0,&local_f8);
  while( true ) {
    VX.m_states = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    (&this->m_order);
    bVar6 = __gnu_cxx::operator!=
                      (&local_f0,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&VX.m_states);
    if (!bVar6) break;
    if ((this->m_debug & 1U) != 0) {
      poVar14 = std::operator<<((ostream *)&std::cout,"  Eliminating variable ");
      puVar15 = __gnu_cxx::
                __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_f0);
      this_02 = (void *)std::ostream::operator<<(poVar14,*puVar15);
      std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
    }
    puVar15 = __gnu_cxx::
              __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator*(&local_f0);
    vVar20 = graphical_model::var(&this->super_graphical_model,*puVar15);
    VX.m_label = vVar20.m_states;
    ids.super_my_vector<unsigned_long>.m_n = vVar20.m_label;
    puVar15 = __gnu_cxx::
              __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator*(&local_f0);
    uVar1 = *puVar15;
    sVar18 = std::
             vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             ::size((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                     *)&i_1);
    if (uVar1 < sVar18) {
      puVar15 = __gnu_cxx::
                __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_f0);
      pvVar13 = std::
                vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                ::operator[]((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                              *)&i_1,*puVar15);
      sVar8 = my_set<unsigned_long>::size(pvVar13);
      if (sVar8 != 0) {
        puVar15 = __gnu_cxx::
                  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&local_f0);
        pvVar13 = std::
                  vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                  ::operator[]((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                *)&i_1,*puVar15);
        my_set<unsigned_long>::my_set((my_set<unsigned_long> *)local_130,pvVar13);
        ftmp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)ids.super_my_vector<unsigned_long>.m_n;
        vVar20.m_states = VX.m_label;
        vVar20.m_label = ids.super_my_vector<unsigned_long>.m_n;
        partition(this,vVar20,
                  (vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                  &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
                  (vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   *)&i_1,(vector<double,_std::allocator<double>_> *)local_40,
                  (vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   *)local_b8,
                  (vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   *)local_d8,(flist *)local_130);
        sVar8 = my_set<unsigned_long>::size((my_set<unsigned_long> *)local_130);
        if (1 < sVar8) {
          sVar8 = my_set<unsigned_long>::size((my_set<unsigned_long> *)local_130);
          this_01 = (allocator<merlin::factor> *)((long)&var.m_d + 7);
          std::allocator<merlin::factor>::allocator(this_01);
          std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
                    ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_160,sVar8,
                     this_01);
          std::allocator<merlin::factor>::~allocator
                    ((allocator<merlin::factor> *)((long)&var.m_d + 7));
          puVar12 = my_set<unsigned_long>::operator[]((my_set<unsigned_long> *)local_130,0);
          pvVar10 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                              ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                               &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,*puVar12);
          pvVar16 = factor::vars(pvVar10);
          variable_set::variable_set((variable_set *)&i_3,pvVar16);
          fmatch.c_ = 1;
          fmatch._92_4_ = 0;
          for (; uVar4 = fmatch._88_8_,
              sVar8 = my_set<unsigned_long>::size((my_set<unsigned_long> *)local_130),
              (ulong)uVar4 < sVar8; fmatch._88_8_ = fmatch._88_8_ + 1) {
            puVar12 = my_set<unsigned_long>::operator[]
                                ((my_set<unsigned_long> *)local_130,fmatch._88_8_);
            pvVar10 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                                ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                                 &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,*puVar12);
            pvVar16 = factor::vars(pvVar10);
            variable_set::operator&=((variable_set *)&i_3,pvVar16);
          }
          factor::factor((factor *)&i_4,(variable_set *)&i_3,0.0);
          for (local_210 = 0; uVar1 = local_210,
              sVar8 = my_set<unsigned_long>::size((my_set<unsigned_long> *)local_130), uVar1 < sVar8
              ; local_210 = local_210 + 1) {
            puVar12 = my_set<unsigned_long>::operator[]
                                ((my_set<unsigned_long> *)local_130,local_210);
            pvVar10 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                                ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                                 &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,*puVar12);
            marg((factor *)&i_5,this,pvVar10,(variable_set *)&i_3);
            factor::log((factor *)&i_5,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
            pvVar10 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                                ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                                 local_160,local_210);
            factor::operator=(pvVar10,rhs);
            factor::~factor((factor *)&i_5);
            pvVar10 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                                ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                                 local_160,local_210);
            factor::operator+=((factor *)&i_4,pvVar10);
          }
          sVar8 = my_set<unsigned_long>::size((my_set<unsigned_long> *)local_130);
          auVar19._8_4_ = (int)(sVar8 >> 0x20);
          auVar19._0_8_ = sVar8;
          auVar19._12_4_ = 0x45300000;
          factor::operator*=((factor *)&i_4,
                             1.0 / ((auVar19._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0)));
          for (local_278 = 0;
              sVar8 = my_set<unsigned_long>::size((my_set<unsigned_long> *)local_130),
              local_278 < sVar8; local_278 = local_278 + 1) {
            pvVar10 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                                ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                                 local_160,local_278);
            factor::operator-((factor *)
                              &alphas.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(factor *)&i_4,
                              pvVar10);
            factor::exp((factor *)
                        &alphas.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
            puVar12 = my_set<unsigned_long>::operator[]
                                ((my_set<unsigned_long> *)local_130,local_278);
            pvVar10 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                                ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                                 &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,*puVar12);
            factor::operator*=(pvVar10,B_00);
            factor::~factor((factor *)
                            &alphas.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          factor::~factor((factor *)&i_4);
          variable_set::~variable_set((variable_set *)&i_3);
          std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector
                    ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_160);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_6);
        local_2f8._M_current =
             (unsigned_long *)my_set<unsigned_long>::begin((my_set<unsigned_long> *)local_130);
        while( true ) {
          alpha = (findex)my_set<unsigned_long>::end((my_set<unsigned_long> *)local_130);
          bVar6 = __gnu_cxx::operator!=
                            (&local_2f8,
                             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)&alpha);
          if (!bVar6) break;
          local_308 = 0xffffffffffffffff;
          puVar15 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_2f8);
          pvVar10 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                              ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                               &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,*puVar15);
          iVar7 = (*(this->super_graphical_model)._vptr_graphical_model[2])(this,pvVar10);
          local_308 = CONCAT44(extraout_var,iVar7);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_6,&local_308);
          puVar15 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_f0);
          pvVar13 = std::
                    vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                    ::operator[](&this->m_mini_buckets,*puVar15);
          my_set<unsigned_long>::operator|=(pvVar13,&local_308);
          puVar15 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_2f8);
          pvVar10 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                              ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                               &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,*puVar15);
          variable_set::variable_set
                    ((variable_set *)&maxf,(variable *)&ids.super_my_vector<unsigned_long>.m_n);
          elim(&local_368,this,pvVar10,(variable_set *)&maxf);
          puVar15 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_2f8);
          pvVar10 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                              ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                               &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,*puVar15);
          factor::operator=(pvVar10,&local_368);
          factor::~factor(&local_368);
          variable_set::~variable_set((variable_set *)&maxf);
          puVar15 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_2f8);
          pvVar10 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                              ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                               &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,*puVar15);
          this_03 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                              (&(this->super_graphical_model).m_factors,local_308);
          factor::operator/=(this_03,pvVar10);
          puVar15 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_2f8);
          pvVar10 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                              ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                               &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,*puVar15);
          vVar2 = factor::max(pvVar10);
          puVar15 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_2f8);
          pvVar10 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                              ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                               &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,*puVar15);
          factor::operator/=(pvVar10,vVar2);
          dVar9 = ::log(vVar2);
          this->m_logz = dVar9 + this->m_logz;
          puVar15 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_2f8);
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_40,*puVar15);
          *pvVar11 = dVar9 + *pvVar11;
          for (j_1._M_current = (unsigned_long *)0x0; fVar3._M_current = j_1._M_current,
              sVar18 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_6),
              i_00 = local_308, fVar3._M_current < (unsigned_long *)(sVar18 - 1);
              j_1._M_current = j_1._M_current + 1) {
            pvVar17 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_6,
                                 (size_type)j_1._M_current);
            graph::add_edge(&(this->super_graphical_model).super_graph,i_00,*pvVar17);
          }
          puVar15 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_2f8);
          pvVar13 = std::
                    vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                    ::operator[]((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                  *)local_d8,*puVar15);
          local_3b8._M_current = (unsigned_long *)my_set<unsigned_long>::begin(pvVar13);
          while( true ) {
            puVar15 = __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator*(&local_2f8);
            pvVar13 = std::
                      vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                      ::operator[]((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                    *)local_d8,*puVar15);
            F._88_8_ = my_set<unsigned_long>::end(pvVar13);
            bVar6 = __gnu_cxx::operator!=
                              (&local_3b8,
                               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&F.c_);
            if (!bVar6) break;
            puVar15 = __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator*(&local_3b8);
            graph::add_edge(&(this->super_graphical_model).super_graph,*puVar15,local_308);
            __gnu_cxx::
            __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator++(&local_3b8);
          }
          puVar15 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_2f8);
          pvVar13 = std::
                    vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                    ::operator[]((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                  *)local_b8,*puVar15);
          my_set<unsigned_long>::clear(pvVar13);
          puVar15 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_2f8);
          pvVar13 = std::
                    vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                    ::operator[]((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                  *)local_d8,*puVar15);
          my_set<unsigned_long>::clear(pvVar13);
          puVar15 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_2f8);
          pvVar13 = std::
                    vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                    ::operator[]((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                  *)local_d8,*puVar15);
          my_set<unsigned_long>::operator|=(pvVar13,&local_308);
          puVar15 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_2f8);
          idx = *puVar15;
          puVar15 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_2f8);
          pvVar10 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                              ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                               &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,*puVar15);
          pvVar16 = factor::vars(pvVar10);
          graphical_model::insert
                    (&this->super_graphical_model,
                     (vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                      *)&i_1,idx,pvVar16);
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&local_2f8);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_6);
        my_set<unsigned_long>::~my_set((my_set<unsigned_long> *)local_130);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_f0);
  }
  if ((this->m_debug & 1U) != 0) {
    poVar14 = std::operator<<((ostream *)&std::cout,"Finished creating the join graph.");
    std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  }
  factor::factor((factor *)&i_7,0.0);
  for (local_428 = 0; uVar1 = local_428,
      sVar18 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::size
                         ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                          &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage), uVar1 < sVar18;
      local_428 = local_428 + 1) {
    std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
              ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
               &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_428);
    log((merlin *)&local_488,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
    factor::operator+=((factor *)&i_7,&local_488);
    factor::~factor(&local_488);
  }
  sVar8 = factor::nvar((factor *)&i_7);
  if (sVar8 != 0) {
    __assert_fail("F.nvar() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/src/jglp.cpp"
                  ,0x13d,"virtual void merlin::jglp::run()");
  }
  vVar2 = factor::max((factor *)&i_7);
  this->m_logz = this->m_logz + vVar2;
  poVar14 = std::operator<<((ostream *)&std::cout,"[JGLP] Finished initialization in ");
  dVar9 = timeSystem();
  poVar14 = (ostream *)
            std::ostream::operator<<(poVar14,dVar9 - (this->super_algorithm).m_start_time);
  poVar14 = std::operator<<(poVar14," seconds");
  std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  poVar14 = std::operator<<((ostream *)&std::cout,"[JGLP] Initial Upper Bound is ");
  local_48c = (int)std::setprecision(6);
  poVar14 = std::operator<<(poVar14,(_Setprecision)local_48c);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->m_logz);
  poVar14 = std::operator<<(poVar14," (");
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,std::scientific);
  local_490 = (int)std::setprecision(6);
  poVar14 = std::operator<<(poVar14,(_Setprecision)local_490);
  dVar9 = exp(this->m_logz);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,dVar9);
  poVar14 = std::operator<<(poVar14,")");
  std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  tighten(this,this->m_num_iter,-1.0,-1.0);
  poVar14 = std::operator<<((ostream *)&std::cout,"[JGLP] Final Upper Bound is ");
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,std::fixed);
  local_494 = (int)std::setprecision(6);
  poVar14 = std::operator<<(poVar14,(_Setprecision)local_494);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->m_logz);
  poVar14 = std::operator<<(poVar14," (");
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,std::scientific);
  local_498 = (int)std::setprecision(6);
  poVar14 = std::operator<<(poVar14,(_Setprecision)local_498);
  dVar9 = exp(this->m_logz);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,dVar9);
  poVar14 = std::operator<<(poVar14,")");
  std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  dVar9 = graphical_model::logP(&this->m_gmo,&this->m_best_config);
  this->m_lb = dVar9;
  poVar14 = std::operator<<((ostream *)&std::cout,"[JGLP] Final Lower Bound is ");
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,std::fixed);
  local_49c = (int)std::setprecision(6);
  poVar14 = std::operator<<(poVar14,(_Setprecision)local_49c);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->m_lb);
  poVar14 = std::operator<<(poVar14," (");
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,std::scientific);
  local_4a0 = (int)std::setprecision(6);
  poVar14 = std::operator<<(poVar14,(_Setprecision)local_4a0);
  dVar9 = exp(this->m_lb);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,dVar9);
  poVar14 = std::operator<<(poVar14,")");
  std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  poVar14 = std::operator<<((ostream *)&std::cout,"MAP");
  std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  sVar18 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_best_config);
  poVar14 = (ostream *)std::ostream::operator<<(&std::cout,sVar18);
  std::operator<<(poVar14," ");
  local_4a8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->m_best_config);
  local_4b0 = (ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->m_best_config);
  std::ostream_iterator<unsigned_long,_char,_std::char_traits<char>_>::ostream_iterator
            (&local_4c0,(ostream_type *)&std::cout," ");
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::ostream_iterator<unsigned_long,char,std::char_traits<char>>>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_4d0,local_4a8,local_4b0);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  factor::~factor((factor *)&i_7);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  ~vector((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> *)
          local_d8);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  ~vector((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> *)
          local_b8);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  ~vector((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> *)
          &i_1);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector
            ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
             &Norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void jglp::run() {

	// Start the timer and store it
	m_start_time = timeSystem();

	// Initialize
	init();

	// Prepare the buckets
	std::vector<factor> fin(m_gmo.get_factors()); // get the original input factors
	std::vector<double> Norm(m_gmo.num_factors(), 0.0); // and normalize them
	for (size_t i = 0; i < m_gmo.num_factors(); ++i) {
		double mx = fin[i].max();
		fin[i] /= mx;
		Norm[i] = std::log(mx);
		m_logz += Norm[i];
	}

	// Map each variable to the list of factors mentioning that variable
	std::vector<flist> vin;
	for (size_t i = 0; i < m_gmo.nvar(); ++i) {
		vin.push_back(m_gmo.with_variable(var(i)));
	}

	// Origination info: which original factors are included for the first
	// time, and which newly created clusters feed into this cluster
	std::vector<flist> Orig(m_gmo.num_factors());
	std::vector<flist> New(m_gmo.num_factors());
	for (size_t i = 0; i < Orig.size(); ++i) {
		Orig[i] |= i;
	}

	// save the mini-buckets (as lists of factor indeces)
	m_mini_buckets.resize(m_gmo.nvar());

	// Eliminate each variable in the sequence given:
	std::cout << "[JGLP] Initialize join graph ..." << std::endl;

	for (variable_order_t::const_iterator x = m_order.begin(); x != m_order.end(); ++x) {

		if (m_debug) {
			std::cout << "  Eliminating variable " << *x << std::endl;
		}

		variable VX = var(*x);
		if (*x >= vin.size() || vin[*x].size() == 0)
			continue;  // check that we have some factors over this variable


		// list of factor IDs contained in this bucket
		flist ids = vin[*x];

		// partition into mini-buckets
		partition(VX, fin, vin, Norm, Orig, New, ids);

		// Perform any matching?
		//    "Matching" here is: compute the largest overlap of all buckets,
		//    and ensure that the
		//    moments on that subset of variables are identical in all buckets.
		if ( ids.size() > 1 ) {
			std::vector<factor> ftmp(ids.size());  // compute geometric mean
			variable_set var = fin[ids[0]].vars();      // on all mutual variables
			for (size_t i = 1; i < ids.size(); i++)
				var &= fin[ids[i]].vars();
			//Factor fmatch(var,1.0);
			factor fmatch(var, 0.0);
			for (size_t i = 0; i < ids.size(); i++) {
				//ftmp[i] = marg(fin[ids[i]],var);
				//fmatch *= ftmp[i];
				ftmp[i] = marg(fin[ids[i]], var).log();
				fmatch += ftmp[i];
			}
			//fmatch ^= (1.0/ids.size());                  // and match each bucket to it
			fmatch *= (1.0 / ids.size());     // and match each bucket to it
			//for (size_t i=0;i<ids.size();i++) fin[ids[i]] *= fmatch/ftmp[i];
			for (size_t i = 0; i < ids.size(); i++)
				fin[ids[i]] *= (fmatch - ftmp[i]).exp();
		}

		// Eliminate individually within buckets
		std::vector<findex> alphas;
		for (flistIt i = ids.begin(); i != ids.end(); ++i) {

			// Create new cluster alpha over this set of variables;
			// save function parameters also
			findex alpha = findex(-1);//, alpha2 = findex(-1);
			alpha = add_factor(fin[*i]);
			alphas.push_back(alpha);
			m_mini_buckets[*x] |= alpha;

			fin[*i] = elim(fin[*i], VX);

			m_factors[alpha] /= fin[*i];

			// normalize for numerical stability
			double maxf = fin[*i].max();
			fin[*i] /= maxf;
			maxf = std::log(maxf);
			m_logz += maxf;
			Norm[*i] += maxf; // save normalization for overall bound

			for (size_t j = 0; j < alphas.size() - 1; ++j)
				add_edge(alpha, alphas[j]);
			for (flistIt j = New[*i].begin(); j != New[*i].end(); ++j)
				add_edge(*j, alpha);

			Orig[*i].clear();
			New[*i].clear();
			New[*i] |= alpha;  // now incoming nodes to *i is just alpha

			insert(vin, *i, fin[*i].vars()); // recompute and update adjacency
		}
	}
	/// end for: variable elim order

	if (m_debug) {
		std::cout << "Finished creating the join graph." << std::endl;
	}

	// Compute the initial upper bound
	factor F(0.0);
	for (size_t i = 0; i < fin.size(); ++i)
		F += log(fin[i]);
	assert(F.nvar() == 0);
	m_logz += F.max();

	std::cout << "[JGLP] Finished initialization in " << (timeSystem() - m_start_time) << " seconds" << std::endl;
	std::cout << "[JGLP] Initial Upper Bound is "
		<< std::setprecision(MERLIN_PRECISION)
		<< m_logz << " (" << std::scientific
		<< std::setprecision(MERLIN_PRECISION)
		<< std::exp(m_logz)	<< ")" << std::endl;

	// Followed by iterative cost-shifting tighteing via JG propagation
	tighten(m_num_iter);

	// Output the MAP assignment
	std::cout << "[JGLP] Final Upper Bound is "
		<< std::fixed << std::setprecision(MERLIN_PRECISION)
		<< m_logz << " (" << std::scientific
		<< std::setprecision(MERLIN_PRECISION)
		<< std::exp(m_logz)	<< ")" << std::endl;

	m_lb = m_gmo.logP(m_best_config);
	std::cout << "[JGLP] Final Lower Bound is "
		<< std::fixed << std::setprecision(MERLIN_PRECISION)
		<< m_lb << " (" << std::scientific
		<< std::setprecision(MERLIN_PRECISION)
		<< std::exp(m_lb) << ")" << std::endl;

	std::cout << "MAP" << std::endl;
	std::cout << m_best_config.size() << " ";
	std::copy(m_best_config.begin(), m_best_config.end(),
			std::ostream_iterator<index>(std::cout, " "));
	std::cout << std::endl;
}